

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O1

Opnd * __thiscall IR::Instr::DeepReplace(Instr *this,Opnd *oldOpnd,Opnd *newOpnd)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Opnd *pOVar4;
  
  if (oldOpnd == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0xa69,"(oldOpnd)","oldOpnd");
    if (!bVar2) goto LAB_004bf76b;
    *puVar3 = 0;
  }
  if (newOpnd == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0xa6a,"(newOpnd)","newOpnd");
    if (!bVar2) {
LAB_004bf76b:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pOVar4 = this->m_dst;
  if (pOVar4 != oldOpnd && pOVar4 != (Opnd *)0x0) {
    bVar2 = Opnd::IsEqual(oldOpnd,pOVar4);
    if (bVar2) {
      ReplaceDst(this,newOpnd);
    }
  }
  pOVar4 = this->m_src1;
  if (pOVar4 != oldOpnd && pOVar4 != (Opnd *)0x0) {
    bVar2 = Opnd::IsEqual(oldOpnd,pOVar4);
    if (bVar2) {
      ReplaceSrc1(this,newOpnd);
    }
  }
  pOVar4 = this->m_src2;
  if (pOVar4 != oldOpnd && pOVar4 != (Opnd *)0x0) {
    bVar2 = Opnd::IsEqual(oldOpnd,pOVar4);
    if (bVar2) {
      ReplaceSrc2(this,newOpnd);
    }
  }
  pOVar4 = Replace(this,oldOpnd,newOpnd);
  return pOVar4;
}

Assistant:

Opnd *Instr::DeepReplace(Opnd *const oldOpnd, Opnd *const newOpnd)
{
    Assert(oldOpnd);
    Assert(newOpnd);

    IR::Opnd *opnd = GetDst();
    if(opnd && oldOpnd != opnd && oldOpnd->IsEqual(opnd))
    {
        ReplaceDst(newOpnd);
    }
    opnd = GetSrc1();
    if(opnd && oldOpnd != opnd && oldOpnd->IsEqual(opnd))
    {
        ReplaceSrc1(newOpnd);
    }
    opnd = GetSrc2();
    if(opnd && oldOpnd != opnd && oldOpnd->IsEqual(opnd))
    {
        ReplaceSrc2(newOpnd);
    }

    // Do this last because Replace will delete oldOpnd
    return Replace(oldOpnd, newOpnd);
}